

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O2

map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
* __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeBrandDepMap
          (map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
           *__return_storage_ptr__,CapnpcCppMain *this,TemplateContext *templateContext,
          Schema schema)

{
  _Rb_tree_header *p_Var1;
  short sVar2;
  Method method;
  Method method_00;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  mapped_type *pmVar10;
  Schema type;
  StructSchema SVar11;
  uint index;
  unsigned_long i_1;
  unsigned_long i;
  ulong uVar12;
  Type TVar13;
  StringPtr suffix;
  StringPtr suffix_00;
  uint location_2;
  InterfaceSchema interface;
  Schema schema_local;
  NullableValue<kj::StringTree> dep;
  NullableValue<kj::StringTree> dep_2;
  MethodList methods;
  uint location;
  uint local_88;
  uint location_1;
  undefined4 uStack_6c;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  schema_local.raw = (RawBrandedSchema *)templateContext;
  Schema::getProto((Reader *)&dep,&schema_local);
  if (0x6f < (uint)dep.field_1._24_4_) {
    sVar2 = *(short *)(dep.field_1.value.text.content.ptr + 0xc);
    if (sVar2 == 1) {
      dep._0_8_ = Schema::asStruct(&schema_local);
      StructSchema::getFields((FieldList *)&location,(StructSchema *)&dep);
      methods.parent.super_Schema.raw = (Schema)(RawBrandedSchema *)&location;
      for (methods.list.reader.segment._0_4_ = 0; (uint)methods.list.reader.segment != local_88;
          methods.list.reader.segment._0_4_ = (uint)methods.list.reader.segment + 1) {
        _::IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::
        operator*((Field *)&dep,
                  (IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                   *)&methods);
        interface.super_Schema.raw =
             (Schema)(CONCAT44(interface.super_Schema.raw._4_4_,dep.field_1.value.size_._0_4_) |
                     0x1000000);
        TVar13 = StructSchema::Field::getType((Field *)&dep);
        makeBrandDepInitializer((Maybe<kj::StringTree> *)&location_1,this,TVar13);
        kj::_::NullableValue<kj::StringTree>::NullableValue
                  (&dep_2,(NullableValue<kj::StringTree> *)&location_1);
        kj::_::NullableValue<kj::StringTree>::~NullableValue
                  ((NullableValue<kj::StringTree> *)&location_1);
        if (dep_2.isSet == true) {
          pmVar10 = std::
                    map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                    ::operator[](__return_storage_ptr__,(key_type_conflict *)&interface);
          kj::StringTree::operator=(pmVar10,&dep_2.field_1.value);
        }
        kj::_::NullableValue<kj::StringTree>::~NullableValue(&dep_2);
      }
    }
    else if (sVar2 == 3) {
      interface = Schema::asInterface(&schema_local);
      InterfaceSchema::getSuperclasses((SuperclassList *)&location,&interface);
      for (uVar12 = 0; local_88 != uVar12; uVar12 = uVar12 + 1) {
        _location_1 = (RawBrandedSchema *)(CONCAT44(uStack_6c,(uint)uVar12) | 0x4000000);
        type.raw = (RawBrandedSchema *)
                   InterfaceSchema::SuperclassList::operator[]
                             ((SuperclassList *)&location,(uint)uVar12);
        makeBrandDepInitializer((Maybe<kj::StringTree> *)&dep_2,this,type);
        kj::_::NullableValue<kj::StringTree>::NullableValue(&dep,&dep_2);
        kj::_::NullableValue<kj::StringTree>::~NullableValue(&dep_2);
        if (dep.isSet == true) {
          pmVar10 = std::
                    map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                    ::operator[](__return_storage_ptr__,&location_1);
          kj::StringTree::operator=(pmVar10,&dep.field_1.value);
        }
        kj::_::NullableValue<kj::StringTree>::~NullableValue(&dep);
      }
      InterfaceSchema::getMethods(&methods,&interface);
      for (uVar12 = 0; methods.list.reader.elementCount != uVar12; uVar12 = uVar12 + 1) {
        index = (uint)uVar12;
        InterfaceSchema::MethodList::operator[]((Method *)&dep,&methods,index);
        uVar9 = dep.field_1.value.branches.disposer;
        uVar7 = dep.field_1.value.branches.size_;
        uVar6 = dep.field_1.value.branches.ptr;
        uVar5 = dep.field_1.value.text.content.size_;
        uVar4 = dep.field_1.value.text.content.ptr;
        uVar3 = dep._0_8_;
        location_2 = index | 0x2000000;
        method._12_4_ = dep.field_1.value.size_._4_4_;
        method._8_4_ = dep.field_1.value.size_._0_4_;
        method.proto._reader.data._4_4_ = dep.field_1._28_4_;
        method.proto._reader.data._0_4_ = dep.field_1._24_4_;
        SVar11 = InterfaceSchema::Method::getParamType((Method *)&dep);
        uVar8 = dep.field_1.value.branches.size_;
        method.parent.super_Schema.raw = (Schema)(Schema)uVar3;
        method.proto._reader.segment = (SegmentReader *)uVar4;
        method.proto._reader.capTable = (CapTableReader *)uVar5;
        method.proto._reader.pointers = (WirePointer *)uVar6;
        dep.field_1._40_4_ = (undefined4)uVar7;
        dep.field_1._44_2_ = SUB82(uVar7,4);
        dep.field_1._46_2_ = SUB82(uVar7,6);
        method.proto._reader.dataSize = dep.field_1._40_4_;
        method.proto._reader.pointerCount = dep.field_1._44_2_;
        method.proto._reader._38_2_ = dep.field_1._46_2_;
        method.proto._reader._40_8_ = uVar9;
        suffix.content.size_ = 7;
        suffix.content.ptr = "Params";
        dep.field_1.value.branches.size_ = uVar8;
        makeBrandDepInitializer((Maybe<kj::StringTree> *)&location_1,this,method,SVar11,suffix);
        kj::_::NullableValue<kj::StringTree>::NullableValue
                  (&dep_2,(NullableValue<kj::StringTree> *)&location_1);
        kj::_::NullableValue<kj::StringTree>::~NullableValue
                  ((NullableValue<kj::StringTree> *)&location_1);
        if (dep_2.isSet == true) {
          pmVar10 = std::
                    map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                    ::operator[](__return_storage_ptr__,&location_2);
          kj::StringTree::operator=(pmVar10,&dep_2.field_1.value);
        }
        kj::_::NullableValue<kj::StringTree>::~NullableValue(&dep_2);
        uVar9 = dep.field_1.value.branches.disposer;
        uVar7 = dep.field_1.value.branches.size_;
        uVar6 = dep.field_1.value.branches.ptr;
        uVar5 = dep.field_1.value.text.content.size_;
        uVar4 = dep.field_1.value.text.content.ptr;
        uVar3 = dep._0_8_;
        location_2 = index | 0x3000000;
        method_00._12_4_ = dep.field_1.value.size_._4_4_;
        method_00._8_4_ = dep.field_1.value.size_._0_4_;
        method_00.proto._reader.data._4_4_ = dep.field_1._28_4_;
        method_00.proto._reader.data._0_4_ = dep.field_1._24_4_;
        SVar11 = InterfaceSchema::Method::getResultType((Method *)&dep);
        uVar8 = dep.field_1.value.branches.size_;
        method_00.parent.super_Schema.raw = (Schema)(Schema)uVar3;
        method_00.proto._reader.segment = (SegmentReader *)uVar4;
        method_00.proto._reader.capTable = (CapTableReader *)uVar5;
        method_00.proto._reader.pointers = (WirePointer *)uVar6;
        dep.field_1._40_4_ = (undefined4)uVar7;
        dep.field_1._44_2_ = SUB82(uVar7,4);
        dep.field_1._46_2_ = SUB82(uVar7,6);
        method_00.proto._reader.dataSize = dep.field_1._40_4_;
        method_00.proto._reader.pointerCount = dep.field_1._44_2_;
        method_00.proto._reader._38_2_ = dep.field_1._46_2_;
        method_00.proto._reader._40_8_ = uVar9;
        suffix_00.content.size_ = 8;
        suffix_00.content.ptr = "Results";
        dep.field_1.value.branches.size_ = uVar8;
        makeBrandDepInitializer
                  ((Maybe<kj::StringTree> *)&location_1,this,method_00,SVar11,suffix_00);
        kj::_::NullableValue<kj::StringTree>::NullableValue
                  (&dep_2,(NullableValue<kj::StringTree> *)&location_1);
        kj::_::NullableValue<kj::StringTree>::~NullableValue
                  ((NullableValue<kj::StringTree> *)&location_1);
        if (dep_2.isSet == true) {
          pmVar10 = std::
                    map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                    ::operator[](__return_storage_ptr__,&location_2);
          kj::StringTree::operator=(pmVar10,&dep_2.field_1.value);
        }
        kj::_::NullableValue<kj::StringTree>::~NullableValue(&dep_2);
      }
    }
    else if (sVar2 == 4) {
      location = 0x5000000;
      _location_1 = (RawBrandedSchema *)Schema::asConst(&schema_local);
      TVar13 = ConstSchema::getType((ConstSchema *)&location_1);
      makeBrandDepInitializer((Maybe<kj::StringTree> *)&dep_2,this,TVar13);
      kj::_::NullableValue<kj::StringTree>::NullableValue(&dep,&dep_2);
      kj::_::NullableValue<kj::StringTree>::~NullableValue(&dep_2);
      if (dep.isSet == true) {
        pmVar10 = std::
                  map<unsigned_int,_kj::StringTree,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kj::StringTree>_>_>
                  ::operator[](__return_storage_ptr__,&location);
        kj::StringTree::operator=(pmVar10,&dep.field_1.value);
      }
      kj::_::NullableValue<kj::StringTree>::~NullableValue(&dep);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<uint, kj::StringTree>
  makeBrandDepMap(const TemplateContext& templateContext, Schema schema) {
    // Build deps. This is separate from makeBrandDepInitializers to give calling code the
    // opportunity to count the number of dependencies, to calculate array sizes.
    std::map<uint, kj::StringTree> depMap;

#define ADD_DEP(kind, index, ...) \
    { \
      uint location = _::RawBrandedSchema::makeDepLocation( \
          _::RawBrandedSchema::DepKind::kind, index); \
      KJ_IF_MAYBE(dep, makeBrandDepInitializer(__VA_ARGS__)) { \
        depMap[location] = kj::mv(*dep); \
      } \
    }

    switch (schema.getProto().which()) {
      case schema::Node::FILE:
      case schema::Node::ENUM:
      case schema::Node::ANNOTATION:
        break;

      case schema::Node::STRUCT:
        for (auto field: schema.asStruct().getFields()) {
          ADD_DEP(FIELD, field.getIndex(), field.getType());
        }
        break;
      case schema::Node::INTERFACE: {
        auto interface = schema.asInterface();
        auto superclasses = interface.getSuperclasses();
        for (auto i: kj::indices(superclasses)) {
          ADD_DEP(SUPERCLASS, i, superclasses[i]);
        }
        auto methods = interface.getMethods();
        for (auto i: kj::indices(methods)) {
          auto method = methods[i];
          ADD_DEP(METHOD_PARAMS, i, method, method.getParamType(), "Params");
          ADD_DEP(METHOD_RESULTS, i, method, method.getResultType(), "Results");
        }
        break;
      }
      case schema::Node::CONST:
        ADD_DEP(CONST_TYPE, 0, schema.asConst().getType());
        break;
    }
#undef ADD_DEP
    return depMap;
  }